

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

void __thiscall dg::vr::StructureAnalyzer::initializeCallRelations(StructureAnalyzer *this)

{
  CallBase *ptr;
  _Base_ptr p_Var1;
  char cVar2;
  uint uVar3;
  VRLocation *pVVar4;
  long *plVar5;
  CallBase *pCVar6;
  Argument *formalArg;
  Argument *pAVar7;
  Argument *pAVar8;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>,_bool>
  pVar10;
  iterator_range<const_llvm::Argument_*> iVar11;
  Value *realArg;
  Argument *local_90;
  Argument *local_88;
  Argument *local_80;
  StructureAnalyzer *local_78;
  long local_70;
  long local_68;
  StructureAnalyzer *local_60;
  _Base_ptr *local_58;
  _Base_ptr local_50;
  vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> local_48;
  
  local_70 = *(long *)this + 0x18;
  local_78 = this + 0xd0;
  plVar5 = (long *)(*(long *)this + 0x20);
  local_60 = this;
  while (local_68 = *plVar5, local_68 != local_70) {
    local_88 = (Argument *)(local_68 + -0x38);
    if (local_68 == 0) {
      local_88 = (Argument *)0x0;
    }
    cVar2 = llvm::GlobalValue::isDeclaration();
    pAVar8 = local_88;
    if (cVar2 == '\0') {
      local_90 = local_88;
      local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVar10 = std::
               _Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>,std::_Select1st<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
               ::
               _M_emplace_unique<llvm::Function_const*,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>
                         ((_Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>,std::_Select1st<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
                           *)local_78,(Function **)&local_90,&local_48);
      std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::~vector(&local_48);
      local_58 = &pVar10.first._M_node._M_node[1]._M_parent;
      local_50 = pVar10.first._M_node._M_node;
      while (pAVar8 = *(Argument **)(pAVar8 + 8), pAVar8 != (Argument *)0x0) {
        ptr = *(CallBase **)(pAVar8 + 0x18);
        if ((ptr != (CallBase *)0x0) && (ptr[0x10] == (CallBase)0x53)) {
          local_80 = pAVar8;
          std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::emplace_back<>
                    ((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> *)local_58
                    );
          p_Var1 = local_50[1]._M_left;
          pVVar4 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(local_60 + 8),(Instruction *)ptr);
          p_Var1[-1]._M_right = (_Base_ptr)pVVar4;
          iVar11 = llvm::Function::args((Function *)local_88);
          pAVar7 = iVar11.begin_iterator;
          pCVar6 = ptr;
          for (uVar9 = 0;
              (pAVar8 = local_80, pAVar7 != iVar11.end_iterator &&
              (uVar3 = llvm::CallBase::arg_size(ptr), pAVar8 = local_80, uVar9 < uVar3));
              uVar9 = uVar9 + 1) {
            local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 *(pointer *)(pCVar6 + -(ulong)(uint)(*(int *)(ptr + 0x14) << 5));
            local_90 = pAVar7;
            std::
            vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
            ::emplace_back<llvm::Argument_const*,llvm::Value_const*&>
                      ((vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
                        *)(p_Var1 + -1),&local_90,(Value **)&local_48);
            pAVar7 = pAVar7 + 0x28;
            pCVar6 = pCVar6 + 0x20;
          }
        }
      }
    }
    plVar5 = (long *)(local_68 + 8);
  }
  return;
}

Assistant:

void StructureAnalyzer::initializeCallRelations() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        auto pair = callRelationsMap.emplace(&function,
                                             std::vector<CallRelation>());

        // for each location, where the function is called
        for (const llvm::Value *user : function.users()) {
            // get call from user
            const llvm::CallInst *call = llvm::dyn_cast<llvm::CallInst>(user);
            if (!call)
                continue;

            std::vector<CallRelation> &callRelations = pair.first->second;

            callRelations.emplace_back();
            CallRelation &callRelation = callRelations.back();

            // set pointer to the location from which the function is called
            callRelation.callSite = &codeGraph.getVRLocation(call);

            // set formal parameters equal to real
            unsigned argCount = 0;
            for (const llvm::Argument &formalArg : function.args()) {
                if (argCount >= llvmutils::getNumArgOperands(call))
                    break;
                const llvm::Value *realArg = call->getArgOperand(argCount);

                callRelation.equalPairs.emplace_back(&formalArg, realArg);
                ++argCount;
            }
        }
    }
}